

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall
QWidget::create(QWidget *this,WId window,bool initializeWindow,bool destroyOldWindow)

{
  uint uVar1;
  QWidgetPrivate *this_00;
  QWExtra *pQVar2;
  tuple<QTLWExtra_*,_std::default_delete<QTLWExtra>_> tVar3;
  __uniq_ptr_data<QTLWExtra,_std::default_delete<QTLWExtra>,_true,_true> _Var4;
  uint *puVar5;
  long lVar6;
  undefined7 in_register_00000009;
  QWidgetPrivate *pQVar7;
  undefined7 in_register_00000011;
  pointer __p;
  long in_FS_OFFSET;
  char local_48 [24];
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetPrivate **)&this->field_0x8;
  if (window == 0) {
    puVar5 = this_00->high_attributes;
    pQVar7 = this_00;
    if (((this_00->high_attributes[0] & 0x10000000) != 0) && (this->data->winid != 0))
    goto LAB_002f642e;
  }
  else {
    local_48[0] = '\x02';
    local_48[1] = '\0';
    local_48[2] = '\0';
    local_48[3] = '\0';
    local_48[4] = '\0';
    local_48[5] = '\0';
    local_48[6] = '\0';
    local_48[7] = '\0';
    local_48[8] = '\0';
    local_48[9] = '\0';
    local_48[10] = '\0';
    local_48[0xb] = '\0';
    local_48[0xc] = '\0';
    local_48[0xd] = '\0';
    local_48[0xe] = '\0';
    local_48[0xf] = '\0';
    local_48[0x10] = '\0';
    local_48[0x11] = '\0';
    local_48[0x12] = '\0';
    local_48[0x13] = '\0';
    local_48[0x14] = '\0';
    local_48[0x15] = '\0';
    local_48[0x16] = '\0';
    local_48[0x17] = '\0';
    local_30 = "default";
    QMessageLogger::warning
              (local_48,"QWidget::create(): Parameter \'window\' does not have any effect.",
               CONCAT71(in_register_00000011,initializeWindow),
               CONCAT71(in_register_00000009,destroyOldWindow));
    puVar5 = (*(QWidgetPrivate **)&this->field_0x8)->high_attributes;
    pQVar7 = *(QWidgetPrivate **)&this->field_0x8;
  }
  if (((this_00->data).field_0x12 & 4) != 0) goto LAB_002f642e;
  __p = (pointer)this->data;
  uVar1 = *(uint *)((long)&__p->store + 4);
  if (((char)uVar1 == '\x12') || ((uVar1 & 0xff) == 0)) {
    lVar6 = *(long *)&pQVar7->field_0x10;
    if (lVar6 != 0) goto LAB_002f61cf;
    *(uint *)((long)&__p->store + 4) = uVar1 | 1;
  }
  else {
    lVar6 = *(long *)&pQVar7->field_0x10;
    if (lVar6 != 0) {
LAB_002f61cf:
      if ((uVar1 & 1) == 0) {
        if ((((puVar5[2] & 0x10) != 0) && ((puVar5[2] & 0x20) == 0)) &&
           (**(long **)(lVar6 + 0x20) == 0)) {
          QWidgetPrivate::createWinId(this_00);
          goto LAB_002f642e;
        }
      }
      else if (((*(QWidgetPrivate **)(lVar6 + 8))->high_attributes[0] & 0x10000000) == 0) {
        QWidgetPrivate::createWinId(*(QWidgetPrivate **)(lVar6 + 8));
      }
    }
  }
  if (create(unsigned_long_long,bool,bool)::paintOnScreenEnv == '\0') {
    create();
  }
  if (create::paintOnScreenEnv == true) {
    __p = (pointer)0x8;
    setAttribute(this,WA_PaintOnScreen,true);
  }
  if (((byte)QCoreApplicationPrivate::attribs & 8) != 0) {
    __p = (pointer)0x64;
    setAttribute(this,WA_NativeWindow,true);
  }
  if ((((this->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
        super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) &&
     (((pQVar2 = (this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>
                 ._M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                 super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl, pQVar2 == (QWExtra *)0x0 ||
       (tVar3.super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
        super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl =
             *(_Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_> *)
              &(pQVar2->topextra)._M_t.
               super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>,
       tVar3.super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
       super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl ==
       (_Head_base<0UL,_QTLWExtra_*,_false>)0x0)) ||
      ((*(byte *)((long)tVar3.super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                        super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xe1) & 8) == 0))))
  {
    *(byte *)(this_00->high_attributes + 3) = (byte)this_00->high_attributes[3] | 4;
  }
  QWidgetPrivate::updateIsOpaque(this_00);
  uVar1 = *(uint *)(*(long *)&this->field_0x8 + 0x240);
  if ((uVar1 >> 0x1c & 1) == 0) {
    *(uint *)(*(long *)&this->field_0x8 + 0x240) = uVar1 | 0x10000000;
  }
  QWidgetPrivate::create(this_00);
  uVar1 = (this->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
          super_QFlagsStorage<Qt::WindowType>.i;
  if ((uVar1 & 0xff) != 0x11 && (uVar1 & 1) != 0) {
    QWidgetPrivate::createTLExtra(this_00);
    _Var4.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
    super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
    super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl =
         (((this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
           super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
           super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->topextra)._M_t.
         super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>;
    __p = (pointer)operator_new(0xa8);
    QWidgetRepaintManager::QWidgetRepaintManager((QWidgetRepaintManager *)__p,this);
    std::__uniq_ptr_impl<QWidgetRepaintManager,_std::default_delete<QWidgetRepaintManager>_>::reset
              ((__uniq_ptr_impl<QWidgetRepaintManager,_std::default_delete<QWidgetRepaintManager>_>
                *)((long)_Var4.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>.
                         _M_t.super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                         super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 8),__p);
  }
  QWidgetPrivate::setModal_sys(this_00);
  lVar6 = *(long *)&this->field_0x8;
  if (((((this->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) && (*(long *)(lVar6 + 0x10) != 0)) &&
     ((*(byte *)(*(long *)(*(long *)(lVar6 + 0x10) + 8) + 0x245) & 0x80) != 0)) {
    __p = (pointer)0x4f;
    setAttribute(this,WA_DropSiteRegistered,true);
    lVar6 = *(long *)&this->field_0x8;
  }
  if ((*(byte *)(lVar6 + 0x242) & 0x20) != 0) {
    QWidgetPrivate::setWindowIcon_sys(this_00);
  }
  if ((((this->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
        super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) &&
     (QWidgetPrivate::createTLExtra(this_00),
     *(long *)((long)(((this_00->extra)._M_t.
                       super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
                       super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                       super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->topextra)._M_t.
                     super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_> + 0x50) != 0)
     ) {
    QWidgetPrivate::createTLExtra(this_00);
    __p = (pointer)((long)(((this_00->extra)._M_t.
                            super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
                            super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                            super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->topextra)._M_t.
                          super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_> + 0x40);
    QWidgetPrivate::setWindowIconText_helper(this_00,(QString *)__p);
  }
  if ((((this->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
        super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) &&
     (QWidgetPrivate::createTLExtra(this_00),
     *(long *)((long)(((this_00->extra)._M_t.
                       super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
                       super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                       super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->topextra)._M_t.
                     super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_> + 0x38) != 0)
     ) {
    QWidgetPrivate::createTLExtra(this_00);
    __p = (pointer)((long)(((this_00->extra)._M_t.
                            super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
                            super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                            super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->topextra)._M_t.
                          super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_> + 0x28);
    QWidgetPrivate::setWindowTitle_helper(this_00,(QString *)__p);
  }
  if ((((this->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
        super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) &&
     (QWidgetPrivate::createTLExtra(this_00),
     *(long *)((long)(((this_00->extra)._M_t.
                       super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
                       super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                       super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->topextra)._M_t.
                     super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_> + 0x80) != 0)
     ) {
    QWidgetPrivate::createTLExtra(this_00);
    QWidgetPrivate::setWindowFilePath_helper(this_00,(QString *)__p);
  }
  uVar1 = (this->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
          super_QFlagsStorage<Qt::WindowType>.i;
  if (((uVar1 & 1) != 0 && (uVar1 & 0xff) != 0x11) &&
     ((*(byte *)(*(long *)&this->field_0x8 + 0x242) & 0x20) == 0)) {
    QWidgetPrivate::setWindowIcon_sys(this_00);
  }
  QWidgetPrivate::updateFrameStrut(this_00);
LAB_002f642e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidget::create(WId window, bool initializeWindow, bool destroyOldWindow)
{
    Q_UNUSED(initializeWindow);
    Q_UNUSED(destroyOldWindow);

    Q_D(QWidget);
    if (Q_UNLIKELY(window))
        qWarning("QWidget::create(): Parameter 'window' does not have any effect.");
    if (testAttribute(Qt::WA_WState_Created) && window == 0 && internalWinId())
        return;

    if (d->data.in_destructor)
        return;

    Qt::WindowType type = windowType();
    Qt::WindowFlags &flags = data->window_flags;

    if ((type == Qt::Widget || type == Qt::SubWindow) && !parentWidget()) {
        type = Qt::Window;
        flags |= Qt::Window;
    }

    if (QWidget *parent = parentWidget()) {
        if (type & Qt::Window) {
            if (!parent->testAttribute(Qt::WA_WState_Created))
                parent->createWinId();
        } else if (testAttribute(Qt::WA_NativeWindow) && !parent->internalWinId()
                   && !testAttribute(Qt::WA_DontCreateNativeAncestors)) {
            // We're about to create a native child widget that doesn't have a native parent;
            // enforce a native handle for the parent unless the Qt::WA_DontCreateNativeAncestors
            // attribute is set.
            d->createWinId();
            // Nothing more to do.
            Q_ASSERT(testAttribute(Qt::WA_WState_Created));
            Q_ASSERT(internalWinId());
            return;
        }
    }


    static const bool paintOnScreenEnv = qEnvironmentVariableIntValue("QT_ONSCREEN_PAINT") > 0;
    if (paintOnScreenEnv)
        setAttribute(Qt::WA_PaintOnScreen);

    if (QApplicationPrivate::testAttribute(Qt::AA_NativeWindows))
        setAttribute(Qt::WA_NativeWindow);

    if (isWindow()) {
        // Make top levels automatically respect safe areas by default
        auto *topExtra = d->maybeTopData();
        if (!topExtra || !topExtra->explicitContentsMarginsRespectsSafeArea) {
            setAttribute_internal(Qt::WA_ContentsMarginsRespectsSafeArea,
                true, data, d);
        }
    }

    d->updateIsOpaque();

    setAttribute(Qt::WA_WState_Created);                        // set created flag
    d->create();

    // A real toplevel window needs a paint manager
    if (isWindow() && windowType() != Qt::Desktop)
        d->topData()->repaintManager.reset(new QWidgetRepaintManager(this));

    d->setModal_sys();

    if (!isWindow() && parentWidget() && parentWidget()->testAttribute(Qt::WA_DropSiteRegistered))
        setAttribute(Qt::WA_DropSiteRegistered, true);

    // need to force the resting of the icon after changing parents
    if (testAttribute(Qt::WA_SetWindowIcon))
        d->setWindowIcon_sys();

    if (isWindow() && !d->topData()->iconText.isEmpty())
        d->setWindowIconText_helper(d->topData()->iconText);
    if (isWindow() && !d->topData()->caption.isEmpty())
        d->setWindowTitle_helper(d->topData()->caption);
    if (isWindow() && !d->topData()->filePath.isEmpty())
        d->setWindowFilePath_helper(d->topData()->filePath);
    if (windowType() != Qt::Desktop) {
        d->updateSystemBackground();

        if (isWindow() && !testAttribute(Qt::WA_SetWindowIcon))
            d->setWindowIcon_sys();
    }

    // Frame strut update needed in cases where there are native widgets such as QGLWidget,
    // as those force native window creation on their ancestors before they are shown.
    // If the strut is not updated, any subsequent move of the top level window before show
    // will cause window frame to be ignored when positioning the window.
    // Note that this only helps on platforms that handle window creation synchronously.
    d->updateFrameStrut();
}